

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocketclient.cpp
# Opt level: O0

void __thiscall session::LoopRead(session *this)

{
  shared_ptr<session> *in_RCX;
  enable_shared_from_this<session> local_50;
  code *local_40;
  undefined8 local_38;
  bind_front_wrapper<void_(session::*)(boost::system::error_code,_unsigned_long),_std::shared_ptr<session>_>
  local_30;
  session *local_10;
  session *this_local;
  
  local_40 = on_read;
  local_38 = 0;
  local_10 = this;
  std::enable_shared_from_this<session>::shared_from_this(&local_50);
  boost::beast::
  bind_front_handler<void(session::*)(boost::system::error_code,unsigned_long),std::shared_ptr<session>>
            (&local_30,(beast *)&local_40,(offset_in_session_to_subr *)&local_50,in_RCX);
  boost::beast::websocket::
  stream<boost::beast::ssl_stream<boost::beast::basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>>,true>
  ::
  async_read<boost::beast::basic_flat_buffer<std::allocator<char>>,boost::beast::detail::bind_front_wrapper<void(session::*)(boost::system::error_code,unsigned_long),std::shared_ptr<session>>>
            ((stream<boost::beast::ssl_stream<boost::beast::basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>>,true>
              *)&this->ws_,&this->buffer_,&local_30);
  boost::beast::detail::
  bind_front_wrapper<void_(session::*)(boost::system::error_code,_unsigned_long),_std::shared_ptr<session>_>
  ::~bind_front_wrapper(&local_30);
  std::shared_ptr<session>::~shared_ptr((shared_ptr<session> *)&local_50);
  return;
}

Assistant:

void
session::LoopRead() {
#ifdef DEBUG_PRINT
    std::clog << "> Read" << std::endl;
#endif
    ws_.async_read(
            buffer_,
            beast::bind_front_handler(
                    &session::on_read,
                    shared_from_this()));
}